

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DifferentialTest.h
# Opt level: O0

bool DiffTest<Blob<64>,unsigned_long>(pfHash hash,int diffbits,int reps,bool dumpCollisions)

{
  bool bVar1;
  uint in_EDX;
  uint in_ESI;
  code *in_RDI;
  double dVar2;
  double dVar3;
  bool result;
  int i;
  unsigned_long h2;
  unsigned_long h1;
  Blob<64> k2;
  Blob<64> k1;
  vector<Blob<64>,_std::allocator<Blob<64>_>_> diffs;
  Rand r;
  double expected;
  double testcount;
  double diffcount;
  int hashbits;
  int keybits;
  uint32_t in_stack_ffffffffffffff3c;
  Rand *in_stack_ffffffffffffff40;
  vector<Blob<64>,_std::allocator<Blob<64>_>_> *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  Rand *this;
  undefined4 in_stack_ffffffffffffff68;
  byte bVar4;
  int start;
  int iVar5;
  Blob<64> *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  vector<Blob<64>,_std::allocator<Blob<64>_>_> *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff90;
  Blob<64> in_stack_ffffffffffffff98;
  
  dVar2 = chooseUpToK((int)((ulong)in_stack_ffffffffffffff40 >> 0x20),(int)in_stack_ffffffffffffff40
                     );
  this = (Rand *)(dVar2 * (double)(int)in_EDX);
  dVar3 = pow(2.0,64.0);
  dVar3 = (double)this / dVar3;
  Rand::Rand(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  std::vector<Blob<64>,_std::allocator<Blob<64>_>_>::vector
            ((vector<Blob<64>,_std::allocator<Blob<64>_>_> *)0x14acce);
  Blob<64>::Blob((Blob<64> *)&stack0xffffffffffffff98);
  Blob<64>::Blob((Blob<64> *)&stack0xffffffffffffff84);
  printf("Testing %0.f up-to-%d-bit differentials in %d-bit keys -> %d bit hashes.\n",dVar2,
         (ulong)in_ESI,0x40);
  printf("%d reps, %0.f total tests, expecting %2.2f random collisions",
         (Rand *)(dVar2 * (double)(int)in_EDX),dVar3,(ulong)in_EDX);
  start = 0;
  while (start < (int)in_EDX) {
    iVar5 = start;
    if (start % ((int)in_EDX / 10) == 0) {
      printf(".");
    }
    Rand::rand_p(this,(void *)CONCAT44(start,in_stack_ffffffffffffff58),
                 (int)((ulong)in_stack_ffffffffffffff50 >> 0x20));
    in_stack_ffffffffffffff50 =
         (vector<Blob<64>,_std::allocator<Blob<64>_>_> *)&stack0xffffffffffffff98;
    Blob<64>::operator=((Blob<64> *)&stack0xffffffffffffff84,(Blob<64> *)in_stack_ffffffffffffff50);
    (*in_RDI)(in_stack_ffffffffffffff50,8,0,&stack0xffffffffffffff78);
    DiffTestRecurse<Blob<64>,unsigned_long>
              ((pfHash)in_stack_ffffffffffffff80,
               (Blob<64> *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
               in_stack_ffffffffffffff70,(unsigned_long *)CONCAT44(iVar5,in_stack_ffffffffffffff68),
               (unsigned_long *)this,start,in_stack_ffffffffffffff90,
               (vector<Blob<64>,_std::allocator<Blob<64>_>_> *)in_stack_ffffffffffffff98.bytes);
    start = iVar5 + 1;
  }
  printf("\n");
  bVar4 = 1;
  bVar1 = ProcessDifferentials<Blob<64>>
                    (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                     SUB41((uint)in_stack_ffffffffffffff78 >> 0x18,0));
  std::vector<Blob<64>,_std::allocator<Blob<64>_>_>::~vector(in_stack_ffffffffffffff50);
  return (bVar4 & 1 & bVar1) != 0;
}

Assistant:

bool DiffTest ( pfHash hash, int diffbits, int reps, bool dumpCollisions )
{
  const int keybits = sizeof(keytype) * 8;
  const int hashbits = sizeof(hashtype) * 8;

  double diffcount = chooseUpToK(keybits,diffbits);
  double testcount = (diffcount * double(reps));
  double expected  = testcount / pow(2.0,double(hashbits));

  Rand r(100);

  std::vector<keytype> diffs;

  keytype k1,k2;
  hashtype h1,h2;

  printf("Testing %0.f up-to-%d-bit differentials in %d-bit keys -> %d bit hashes.\n",
         diffcount,diffbits,keybits,hashbits);
  printf("%d reps, %0.f total tests, expecting %2.2f random collisions",
         reps,testcount,expected);

  for(int i = 0; i < reps; i++)
  {
    if(i % (reps/10) == 0) printf(".");

    r.rand_p(&k1,sizeof(keytype));
    k2 = k1;

    hash(&k1,sizeof(k1),0,(uint32_t*)&h1);

    DiffTestRecurse<keytype,hashtype>(hash,k1,k2,h1,h2,0,diffbits,diffs);
  }
  printf("\n");

  bool result = true;

  result &= ProcessDifferentials(diffs,reps,dumpCollisions);

  return result;
}